

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iadst4x4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  int32_t iVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int iVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  long lVar13;
  int iVar15;
  int iVar16;
  undefined1 auVar14 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar20 [16];
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar32;
  int iVar34;
  undefined1 auVar29 [16];
  int iVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar49;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar50;
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  uint uVar33;
  
  iVar10 = bit + -10;
  auVar12 = ZEXT416((uint)(1 << ((char)bit + 3U & 0x1f)));
  auVar12 = insertps(auVar12,auVar12,0x2a);
  iVar4 = av1_sinpi_arr_data[iVar10][1];
  auVar36._4_4_ = iVar4;
  auVar36._0_4_ = iVar4;
  auVar36._8_4_ = iVar4;
  auVar36._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar10][2];
  auVar14._4_4_ = iVar4;
  auVar14._0_4_ = iVar4;
  auVar14._8_4_ = iVar4;
  auVar14._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar10][3];
  auVar42._4_4_ = iVar4;
  auVar42._0_4_ = iVar4;
  auVar42._8_4_ = iVar4;
  auVar42._12_4_ = iVar4;
  iVar4 = av1_sinpi_arr_data[iVar10][4];
  auVar41._4_4_ = iVar4;
  auVar41._0_4_ = iVar4;
  auVar41._8_4_ = iVar4;
  auVar41._12_4_ = iVar4;
  alVar1 = *in;
  alVar2 = in[2];
  alVar3 = in[3];
  auVar51 = pmulld((undefined1  [16])alVar1,auVar36);
  auVar20 = pmulld((undefined1  [16])alVar1,auVar14);
  auVar29 = pmulld((undefined1  [16])in[1],auVar42);
  auVar52 = pmulld((undefined1  [16])alVar2,auVar41);
  auVar14 = pmulld(auVar14,(undefined1  [16])alVar3);
  iVar10 = auVar14._0_4_ + auVar52._0_4_ + auVar51._0_4_;
  iVar15 = auVar14._4_4_ + auVar52._4_4_ + auVar51._4_4_;
  iVar16 = auVar14._8_4_ + auVar52._8_4_ + auVar51._8_4_;
  iVar17 = auVar14._12_4_ + auVar52._12_4_ + auVar51._12_4_;
  auVar26._0_4_ = ((int)alVar1[0] - (int)alVar2[0]) + (int)alVar3[0];
  auVar26._4_4_ = (alVar1[0]._4_4_ - alVar2[0]._4_4_) + alVar3[0]._4_4_;
  auVar26._8_4_ = ((int)alVar1[1] - (int)alVar2[1]) + (int)alVar3[1];
  auVar26._12_4_ = (alVar1[1]._4_4_ - alVar2[1]._4_4_) + alVar3[1]._4_4_;
  auVar14 = pmulld((undefined1  [16])alVar2,auVar36);
  auVar51 = pmulld((undefined1  [16])alVar3,auVar41);
  iVar18 = auVar20._0_4_ - (auVar51._0_4_ + auVar14._0_4_);
  iVar21 = auVar20._4_4_ - (auVar51._4_4_ + auVar14._4_4_);
  iVar23 = auVar20._8_4_ - (auVar51._8_4_ + auVar14._8_4_);
  iVar24 = auVar20._12_4_ - (auVar51._12_4_ + auVar14._12_4_);
  auVar14 = pmulld(auVar26,auVar42);
  iVar28 = auVar29._0_4_;
  iVar32 = auVar29._4_4_;
  iVar34 = auVar29._8_4_;
  iVar35 = auVar29._12_4_;
  iVar19 = (iVar18 - iVar28) + iVar10;
  iVar22 = (iVar21 - iVar32) + iVar15;
  auVar29._0_8_ = CONCAT44(iVar22,iVar19);
  auVar29._8_4_ = (iVar23 - iVar34) + iVar16;
  auVar29._12_4_ = (iVar24 - iVar35) + iVar17;
  iVar10 = iVar10 + iVar28;
  iVar15 = iVar15 + iVar32;
  auVar20._0_8_ = CONCAT44(iVar15,iVar10);
  auVar20._8_4_ = iVar16 + iVar34;
  auVar20._12_4_ = iVar17 + iVar35;
  iVar18 = iVar18 + iVar28;
  iVar21 = iVar21 + iVar32;
  auVar52._0_8_ = CONCAT44(iVar21,iVar18);
  auVar52._8_4_ = iVar23 + iVar34;
  auVar52._12_4_ = iVar24 + iVar35;
  uVar33 = iVar10 >> 0x1c;
  auVar5._4_8_ = 0;
  auVar5._0_4_ = uVar33;
  auVar30._0_12_ = auVar5 << 0x20;
  auVar30._12_4_ = auVar20._8_4_ >> 0x1c;
  auVar37._0_8_ = (ulong)(auVar20._0_8_ << 0x20) >> 0x1c;
  auVar37._8_8_ = (ulong)(auVar20._8_8_ << 0x20) >> 0x1c;
  auVar51 = pblendw(auVar37,auVar30,0xcc);
  lVar11 = auVar12._0_8_;
  lVar13 = auVar12._8_8_;
  auVar42 = pblendw(auVar20,(undefined1  [16])0x0,0x33);
  auVar12._4_4_ = iVar15 >> 0x1c;
  auVar12._0_4_ = uVar33;
  auVar12._8_4_ = auVar30._12_4_;
  auVar12._12_4_ = auVar20._12_4_ >> 0x1c;
  auVar43._0_8_ = auVar42._0_8_ >> 0x1c;
  auVar43._8_8_ = auVar42._8_8_ >> 0x1c;
  auVar12 = pblendw(auVar43,auVar12,0xcc);
  iVar15 = (int)((ulong)(auVar51._0_8_ + lVar11) >> 0x10);
  iVar28 = (int)((ulong)(auVar12._0_8_ + lVar11) >> 0x10);
  iVar23 = (int)((ulong)(auVar51._8_8_ + lVar13) >> 0x10);
  iVar35 = (int)((ulong)(auVar12._8_8_ + lVar13) >> 0x10);
  uVar33 = iVar18 >> 0x1c;
  auVar6._4_8_ = 0;
  auVar6._0_4_ = uVar33;
  auVar44._0_12_ = auVar6 << 0x20;
  auVar44._12_4_ = auVar52._8_4_ >> 0x1c;
  auVar38._0_8_ = (ulong)(auVar52._0_8_ << 0x20) >> 0x1c;
  auVar38._8_8_ = (ulong)(auVar52._8_8_ << 0x20) >> 0x1c;
  auVar12 = pblendw(auVar38,auVar44,0xcc);
  auVar20 = pblendw(auVar52,(undefined1  [16])0x0,0x33);
  auVar25._4_4_ = iVar21 >> 0x1c;
  auVar25._0_4_ = uVar33;
  auVar25._8_4_ = auVar44._12_4_;
  auVar25._12_4_ = auVar52._12_4_ >> 0x1c;
  auVar45._0_8_ = auVar20._0_8_ >> 0x1c;
  auVar45._8_8_ = auVar20._8_8_ >> 0x1c;
  auVar20 = pblendw(auVar45,auVar25,0xcc);
  iVar16 = (int)((ulong)(auVar12._0_8_ + lVar11) >> 0x10);
  iVar32 = (int)((ulong)(auVar20._0_8_ + lVar11) >> 0x10);
  iVar21 = (int)((ulong)(auVar12._8_8_ + lVar13) >> 0x10);
  iVar49 = (int)((ulong)(auVar20._8_8_ + lVar13) >> 0x10);
  uVar33 = auVar14._0_4_ >> 0x1c;
  auVar7._4_8_ = 0;
  auVar7._0_4_ = uVar33;
  auVar46._0_12_ = auVar7 << 0x20;
  auVar46._12_4_ = auVar14._8_4_ >> 0x1c;
  auVar39._0_8_ = (ulong)(auVar14._0_8_ << 0x20) >> 0x1c;
  auVar39._8_8_ = (ulong)(auVar14._8_8_ << 0x20) >> 0x1c;
  auVar12 = pblendw(auVar39,auVar46,0xcc);
  auVar20 = pblendw(auVar14,(undefined1  [16])0x0,0x33);
  auVar27._4_4_ = auVar14._4_4_ >> 0x1c;
  auVar27._0_4_ = uVar33;
  auVar27._8_4_ = auVar46._12_4_;
  auVar27._12_4_ = auVar14._12_4_ >> 0x1c;
  auVar47._0_8_ = auVar20._0_8_ >> 0x1c;
  auVar47._8_8_ = auVar20._8_8_ >> 0x1c;
  auVar14 = pblendw(auVar47,auVar27,0xcc);
  iVar17 = (int)((ulong)(auVar12._0_8_ + lVar11) >> 0x10);
  iVar34 = (int)((ulong)(auVar14._0_8_ + lVar11) >> 0x10);
  iVar24 = (int)((ulong)(auVar12._8_8_ + lVar13) >> 0x10);
  iVar50 = (int)((ulong)(auVar14._8_8_ + lVar13) >> 0x10);
  uVar33 = iVar19 >> 0x1c;
  auVar8._4_8_ = 0;
  auVar8._0_4_ = uVar33;
  auVar48._0_12_ = auVar8 << 0x20;
  auVar48._12_4_ = auVar29._8_4_ >> 0x1c;
  auVar40._0_8_ = (ulong)(auVar29._0_8_ << 0x20) >> 0x1c;
  auVar40._8_8_ = (ulong)(auVar29._8_8_ << 0x20) >> 0x1c;
  auVar14 = pblendw(auVar40,auVar48,0xcc);
  auVar12 = pblendw((undefined1  [16])0x0,auVar29,0xcc);
  auVar51._4_4_ = iVar22 >> 0x1c;
  auVar51._0_4_ = uVar33;
  auVar51._8_4_ = auVar48._12_4_;
  auVar51._12_4_ = auVar29._12_4_ >> 0x1c;
  auVar31._0_8_ = auVar12._0_8_ >> 0x1c;
  auVar31._8_8_ = auVar12._8_8_ >> 0x1c;
  auVar12 = pblendw(auVar31,auVar51,0xcc);
  iVar10 = (int)((ulong)(auVar14._0_8_ + lVar11) >> 0x10);
  iVar18 = (int)((ulong)(auVar12._0_8_ + lVar11) >> 0x10);
  iVar22 = (int)((ulong)(auVar14._8_8_ + lVar13) >> 0x10);
  iVar19 = (int)((ulong)(auVar12._8_8_ + lVar13) >> 0x10);
  (*out)[0] = CONCAT44(iVar28,iVar15);
  (*out)[1] = CONCAT44(iVar35,iVar23);
  out[1][0] = CONCAT44(iVar32,iVar16);
  out[1][1] = CONCAT44(iVar49,iVar21);
  out[2][0] = CONCAT44(iVar34,iVar17);
  out[2][1] = CONCAT44(iVar50,iVar24);
  out[3][0] = CONCAT44(iVar18,iVar10);
  out[3][1] = CONCAT44(iVar19,iVar22);
  if (do_cols != 0) {
    return;
  }
  iVar9 = 10;
  if (10 < bd) {
    iVar9 = bd;
  }
  local_28 = 0x20 << ((byte)iVar9 & 0x1f);
  local_18 = -local_28;
  local_28 = local_28 + -1;
  if (out_shift != 0) {
    iVar9 = 1 << ((char)out_shift - 1U & 0x1f);
    auVar12 = ZEXT416((uint)out_shift);
    *(int *)*out = iVar15 + iVar9 >> auVar12;
    *(int *)((long)*out + 4) = iVar28 + iVar9 >> auVar12;
    *(int *)(*out + 1) = iVar23 + iVar9 >> auVar12;
    *(int *)((long)*out + 0xc) = iVar35 + iVar9 >> auVar12;
    *(int *)out[1] = iVar16 + iVar9 >> auVar12;
    *(int *)((long)out[1] + 4) = iVar32 + iVar9 >> auVar12;
    *(int *)(out[1] + 1) = iVar21 + iVar9 >> auVar12;
    *(int *)((long)out[1] + 0xc) = iVar49 + iVar9 >> auVar12;
    *(int *)out[2] = iVar17 + iVar9 >> auVar12;
    *(int *)((long)out[2] + 4) = iVar34 + iVar9 >> auVar12;
    *(int *)(out[2] + 1) = iVar24 + iVar9 >> auVar12;
    *(int *)((long)out[2] + 0xc) = iVar50 + iVar9 >> auVar12;
    *(int *)out[3] = iVar10 + iVar9 >> auVar12;
    *(int *)((long)out[3] + 4) = iVar18 + iVar9 >> auVar12;
    *(int *)(out[3] + 1) = iVar22 + iVar9 >> auVar12;
    *(int *)((long)out[3] + 0xc) = iVar19 + iVar9 >> auVar12;
  }
  iStack_24 = local_28;
  iStack_20 = local_28;
  iStack_1c = local_28;
  iStack_14 = local_18;
  iStack_10 = local_18;
  iStack_c = local_18;
  highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,4);
  return;
}

Assistant:

static void iadst4x4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *sinpi = sinpi_arr(bit);
  const __m128i zero = _mm_setzero_si128();
  __m128i rnding = _mm_set1_epi32(1 << (bit + 4 - 1));
  rnding = _mm_unpacklo_epi32(rnding, zero);
  const __m128i mul = _mm_set1_epi32(1 << 4);
  const __m128i sinpi1 = _mm_set1_epi32((int)sinpi[1]);
  const __m128i sinpi2 = _mm_set1_epi32((int)sinpi[2]);
  const __m128i sinpi3 = _mm_set1_epi32((int)sinpi[3]);
  const __m128i sinpi4 = _mm_set1_epi32((int)sinpi[4]);
  __m128i t;
  __m128i s0, s1, s2, s3, s4, s5, s6, s7;
  __m128i x0, x1, x2, x3;
  __m128i u0, u1, u2, u3;
  __m128i u0_low, u1_low, u2_low, u3_low;
  __m128i u0_high, u1_high, u2_high, u3_high;

  x0 = in[0];
  x1 = in[1];
  x2 = in[2];
  x3 = in[3];

  s0 = _mm_mullo_epi32(x0, sinpi1);
  s1 = _mm_mullo_epi32(x0, sinpi2);
  s2 = _mm_mullo_epi32(x1, sinpi3);
  s3 = _mm_mullo_epi32(x2, sinpi4);
  s4 = _mm_mullo_epi32(x2, sinpi1);
  s5 = _mm_mullo_epi32(x3, sinpi2);
  s6 = _mm_mullo_epi32(x3, sinpi4);
  t = _mm_sub_epi32(x0, x2);
  s7 = _mm_add_epi32(t, x3);

  t = _mm_add_epi32(s0, s3);
  s0 = _mm_add_epi32(t, s5);
  t = _mm_sub_epi32(s1, s4);
  s1 = _mm_sub_epi32(t, s6);
  s3 = s2;
  s2 = _mm_mullo_epi32(s7, sinpi3);

  u0 = _mm_add_epi32(s0, s3);
  u1 = _mm_add_epi32(s1, s3);
  u2 = s2;
  t = _mm_add_epi32(s0, s1);
  u3 = _mm_sub_epi32(t, s3);

  // u0
  u0_low = _mm_mul_epi32(u0, mul);
  u0_low = _mm_add_epi64(u0_low, rnding);

  u0 = _mm_srli_si128(u0, 4);
  u0_high = _mm_mul_epi32(u0, mul);
  u0_high = _mm_add_epi64(u0_high, rnding);

  u0_low = _mm_srli_si128(u0_low, 2);
  u0_high = _mm_srli_si128(u0_high, 2);

  u0 = _mm_unpacklo_epi32(u0_low, u0_high);
  u0_high = _mm_unpackhi_epi32(u0_low, u0_high);
  u0 = _mm_unpacklo_epi64(u0, u0_high);

  // u1
  u1_low = _mm_mul_epi32(u1, mul);
  u1_low = _mm_add_epi64(u1_low, rnding);

  u1 = _mm_srli_si128(u1, 4);
  u1_high = _mm_mul_epi32(u1, mul);
  u1_high = _mm_add_epi64(u1_high, rnding);

  u1_low = _mm_srli_si128(u1_low, 2);
  u1_high = _mm_srli_si128(u1_high, 2);

  u1 = _mm_unpacklo_epi32(u1_low, u1_high);
  u1_high = _mm_unpackhi_epi32(u1_low, u1_high);
  u1 = _mm_unpacklo_epi64(u1, u1_high);

  // u2
  u2_low = _mm_mul_epi32(u2, mul);
  u2_low = _mm_add_epi64(u2_low, rnding);

  u2 = _mm_srli_si128(u2, 4);
  u2_high = _mm_mul_epi32(u2, mul);
  u2_high = _mm_add_epi64(u2_high, rnding);

  u2_low = _mm_srli_si128(u2_low, 2);
  u2_high = _mm_srli_si128(u2_high, 2);

  u2 = _mm_unpacklo_epi32(u2_low, u2_high);
  u2_high = _mm_unpackhi_epi32(u2_low, u2_high);
  u2 = _mm_unpacklo_epi64(u2, u2_high);

  // u3
  u3_low = _mm_mul_epi32(u3, mul);
  u3_low = _mm_add_epi64(u3_low, rnding);

  u3 = _mm_srli_si128(u3, 4);
  u3_high = _mm_mul_epi32(u3, mul);
  u3_high = _mm_add_epi64(u3_high, rnding);

  u3_low = _mm_srli_si128(u3_low, 2);
  u3_high = _mm_srli_si128(u3_high, 2);

  u3 = _mm_unpacklo_epi32(u3_low, u3_high);
  u3_high = _mm_unpackhi_epi32(u3_low, u3_high);
  u3 = _mm_unpacklo_epi64(u3, u3_high);

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_4x4(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 4);
  }
}